

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ze_ldrddi.cpp
# Opt level: O2

ze_result_t
loader::zeImageCreate
          (ze_context_handle_t hContext,ze_device_handle_t hDevice,ze_image_desc_t *desc,
          ze_image_handle_t *phImage)

{
  ze_pfnImageCreate_t p_Var1;
  long lVar2;
  ze_result_t zVar3;
  object_t<_ze_image_handle_t_*> *poVar4;
  pthread_mutex_t *__mutex;
  __hashtable *__h;
  ze_image_handle_t internalHandlePtr;
  dditable_t *dditable;
  ze_image_handle_t local_38;
  dditable_t *local_30;
  object_t<_ze_image_handle_t_*> *local_28;
  ze_image_handle_t local_20;
  
  local_30 = *(dditable_t **)(hContext + 8);
  p_Var1 = (local_30->ze).Image.pfnCreate;
  if (p_Var1 == (ze_pfnImageCreate_t)0x0) {
    zVar3 = ZE_RESULT_ERROR_UNINITIALIZED;
  }
  else {
    zVar3 = (*p_Var1)(*(ze_context_handle_t *)hContext,*(ze_device_handle_t *)hDevice,desc,phImage);
    if (zVar3 == ZE_RESULT_SUCCESS) {
      local_38 = *phImage;
      poVar4 = singleton_factory_t<object_t<_ze_image_handle_t*>,_ze_image_handle_t*>::
               getInstance<_ze_image_handle_t*&,dditable_t*&>
                         ((singleton_factory_t<object_t<_ze_image_handle_t*>,_ze_image_handle_t*> *)
                          (context + 0x420),phImage,&local_30);
      *phImage = (ze_image_handle_t)poVar4;
      __mutex = (pthread_mutex_t *)(context + 0x1500);
      std::mutex::lock((mutex *)&__mutex->__data);
      lVar2 = context;
      local_28 = singleton_factory_t<object_t<_ze_image_handle_t*>,_ze_image_handle_t*>::
                 getInstance<_ze_image_handle_t*&,dditable_t*&>
                           ((singleton_factory_t<object_t<_ze_image_handle_t*>,_ze_image_handle_t*>
                             *)(context + 0x420),&local_38,&local_30);
      local_20 = local_38;
      std::
      _Hashtable<object_t<_ze_image_handle_t*>*,std::pair<object_t<_ze_image_handle_t*>*const,_ze_image_handle_t*>,std::allocator<std::pair<object_t<_ze_image_handle_t*>*const,_ze_image_handle_t*>>,std::__detail::_Select1st,std::equal_to<object_t<_ze_image_handle_t*>*>,std::hash<object_t<_ze_image_handle_t*>*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
      ::_M_emplace<std::pair<object_t<_ze_image_handle_t*>*const,_ze_image_handle_t*>>
                ((_Hashtable<object_t<_ze_image_handle_t*>*,std::pair<object_t<_ze_image_handle_t*>*const,_ze_image_handle_t*>,std::allocator<std::pair<object_t<_ze_image_handle_t*>*const,_ze_image_handle_t*>>,std::__detail::_Select1st,std::equal_to<object_t<_ze_image_handle_t*>*>,std::hash<object_t<_ze_image_handle_t*>*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                  *)(lVar2 + 0x1550));
      pthread_mutex_unlock(__mutex);
      zVar3 = ZE_RESULT_SUCCESS;
    }
  }
  return zVar3;
}

Assistant:

__zedlllocal ze_result_t ZE_APICALL
    zeImageCreate(
        ze_context_handle_t hContext,                   ///< [in] handle of the context object
        ze_device_handle_t hDevice,                     ///< [in] handle of the device
        const ze_image_desc_t* desc,                    ///< [in] pointer to image descriptor
        ze_image_handle_t* phImage                      ///< [out] pointer to handle of image object created
        )
    {
        ze_result_t result = ZE_RESULT_SUCCESS;

        // extract driver's function pointer table
        auto dditable = reinterpret_cast<ze_context_object_t*>( hContext )->dditable;
        auto pfnCreate = dditable->ze.Image.pfnCreate;
        if( nullptr == pfnCreate )
            return ZE_RESULT_ERROR_UNINITIALIZED;

        // convert loader handle to driver handle
        hContext = reinterpret_cast<ze_context_object_t*>( hContext )->handle;

        // convert loader handle to driver handle
        hDevice = reinterpret_cast<ze_device_object_t*>( hDevice )->handle;

        // forward to device-driver
        result = pfnCreate( hContext, hDevice, desc, phImage );

        if( ZE_RESULT_SUCCESS != result )
            return result;

        try
        {
            // convert driver handle to loader handle
            ze_image_handle_t internalHandlePtr = *phImage;
            *phImage = reinterpret_cast<ze_image_handle_t>(
                context->ze_image_factory.getInstance( *phImage, dditable ) );
            // convert loader handle to driver handle and store in map
            {
                std::lock_guard<std::mutex> lock(context->image_handle_map_lock);
                context->image_handle_map.insert({context->ze_image_factory.getInstance( internalHandlePtr, dditable ), internalHandlePtr});
            }
        }
        catch( std::bad_alloc& )
        {
            result = ZE_RESULT_ERROR_OUT_OF_HOST_MEMORY;
        }

        return result;
    }